

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkaccesscache.cpp
# Opt level: O1

void __thiscall QNetworkAccessCache::clear(QNetworkAccessCache *this)

{
  void *pvVar1;
  int *piVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  QHash<QByteArray,_QNetworkAccessCache::Node_*> QVar6;
  long in_FS_OFFSET;
  NodeHash hashCopy;
  QHash<QByteArray,_QNetworkAccessCache::Node_*> local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_38.d = *(Data **)(this + 0x10);
  if ((local_38.d != (Data<QHashPrivate::Node<QByteArray,_QNetworkAccessCache::Node_*>_> *)0x0) &&
     (((local_38.d)->ref).atomic._q_value.super___atomic_base<int>._M_i != -1)) {
    LOCK();
    ((local_38.d)->ref).atomic._q_value.super___atomic_base<int>._M_i =
         ((local_38.d)->ref).atomic._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  QHash<QByteArray,_QNetworkAccessCache::Node_*>::clear
            ((QHash<QByteArray,_QNetworkAccessCache::Node_*> *)(this + 0x10));
  if (local_38.d == (Data<QHashPrivate::Node<QByteArray,_QNetworkAccessCache::Node_*>_> *)0x0) {
    QVar6.d = (Data<QHashPrivate::Node<QByteArray,_QNetworkAccessCache::Node_*>_> *)0x0;
  }
  else {
    if (1 < (uint)((local_38.d)->ref).atomic._q_value.super___atomic_base<int>._M_i) {
      local_38.d = QHashPrivate::Data<QHashPrivate::Node<QByteArray,_QNetworkAccessCache::Node_*>_>
                   ::detached(local_38.d);
    }
    QVar6.d = local_38.d;
    if ((local_38.d)->spans->offsets[0] == 0xff) {
      uVar5 = 1;
      do {
        uVar4 = uVar5;
        if ((local_38.d)->numBuckets == uVar4) {
          uVar4 = 0;
          QVar6.d = (Data<QHashPrivate::Node<QByteArray,_QNetworkAccessCache::Node_*>_> *)0x0;
          break;
        }
        uVar5 = uVar4 + 1;
      } while ((local_38.d)->spans[uVar4 >> 7].offsets[(uint)uVar4 & 0x7f] == 0xff);
      goto LAB_0017b2b3;
    }
  }
  uVar4 = 0;
LAB_0017b2b3:
  if (QVar6.d != (Data<QHashPrivate::Node<QByteArray,_QNetworkAccessCache::Node_*>_> *)0x0 ||
      uVar4 != 0) {
    do {
      lVar3 = (uVar4 >> 3 & 0xfffffffffffffff0) * 9;
      uVar5 = (ulong)((uint)uVar4 & 0x7f);
      QByteArray::clear();
      (**(code **)(**(long **)(*(long *)(*(long *)((QVar6.d)->spans->offsets + lVar3 + 0x80) + 0x18
                                        + (ulong)(QVar6.d)->spans->offsets[uVar5 + lVar3] * 0x20) +
                              0x38) + 0x10))();
      pvVar1 = *(void **)(*(long *)((QVar6.d)->spans->offsets + lVar3 + 0x80) + 0x18 +
                         (ulong)(QVar6.d)->spans->offsets[uVar5 + lVar3] * 0x20);
      if (pvVar1 != (void *)0x0) {
        piVar2 = *(int **)((long)pvVar1 + 0x10);
        if (piVar2 != (int *)0x0) {
          LOCK();
          *piVar2 = *piVar2 + -1;
          UNLOCK();
          if (*piVar2 == 0) {
            QArrayData::deallocate(*(QArrayData **)((long)pvVar1 + 0x10),1,0x10);
          }
        }
        operator_delete(pvVar1,0x48);
      }
      do {
        if ((QVar6.d)->numBuckets - 1 == uVar4) {
          QVar6.d = (Data<QHashPrivate::Node<QByteArray,_QNetworkAccessCache::Node_*>_> *)0x0;
          uVar4 = 0;
          break;
        }
        uVar4 = uVar4 + 1;
      } while ((QVar6.d)->spans[uVar4 >> 7].offsets[(uint)uVar4 & 0x7f] == 0xff);
    } while ((QVar6.d != (Data<QHashPrivate::Node<QByteArray,_QNetworkAccessCache::Node_*>_> *)0x0)
            || (uVar4 != 0));
  }
  QHash<QByteArray,_QNetworkAccessCache::Node_*>::clear(&local_38);
  QBasicTimer::stop();
  *(undefined8 *)(this + 0x18) = 0;
  *(undefined8 *)(this + 0x20) = 0;
  QHash<QByteArray,_QNetworkAccessCache::Node_*>::~QHash(&local_38);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QNetworkAccessCache::clear()
{
    NodeHash hashCopy = hash;
    hash.clear();

    // remove all entries
    NodeHash::Iterator it = hashCopy.begin();
    NodeHash::Iterator end = hashCopy.end();
    for ( ; it != end; ++it) {
        (*it)->object->key.clear();
        (*it)->object->dispose();
        delete (*it);
    }

    // now delete:
    hashCopy.clear();

    timer.stop();

    firstExpiringNode = lastExpiringNode = nullptr;
}